

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

QMenu * __thiscall QLineEdit::createStandardContextMenu(QLineEdit *this)

{
  long lVar1;
  void **ppvVar2;
  int *piVar3;
  byte bVar4;
  char cVar5;
  bool bVar6;
  ushort uVar7;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  QAction *pQVar8;
  undefined4 *puVar9;
  undefined8 uVar10;
  QUnicodeControlCharacterMenu *this_01;
  QKeySequence *pQVar11;
  long in_FS_OFFSET;
  QAnyStringView QVar12;
  QObject local_2e8 [8];
  QKeySequence local_2e0 [8];
  QArrayData *local_2d8;
  char16_t *pcStack_2d0;
  qsizetype local_2c8;
  QStringBuilder<char16_t,_QString> local_2b8;
  QKeySequence local_290 [8];
  QString local_288;
  QObject local_270 [8];
  QObject local_268 [8];
  QKeySequence local_260 [8];
  QArrayData *local_258;
  char16_t *pcStack_250;
  qsizetype local_248;
  QStringBuilder<char16_t,_QString> local_238;
  QKeySequence local_210 [8];
  QString local_208;
  QObject local_1e8 [8];
  QKeySequence local_1e0 [8];
  QArrayData *local_1d8;
  char16_t *pcStack_1d0;
  qsizetype local_1c8;
  QStringBuilder<char16_t,_QString> local_1b8;
  QKeySequence local_190 [8];
  QString local_188;
  QObject local_168 [8];
  QKeySequence local_160 [8];
  QArrayData *local_158;
  char16_t *pcStack_150;
  qsizetype local_148;
  QStringBuilder<char16_t,_QString> local_138;
  QKeySequence local_110 [8];
  QObject local_108 [8];
  QKeySequence local_100 [8];
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QStringBuilder<char16_t,_QString> local_e0;
  QKeySequence local_c0 [8];
  QObject local_b8 [8];
  QKeySequence local_b0 [8];
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  qsizetype local_98;
  QStringBuilder<char16_t,_QString> local_90;
  QKeySequence local_70 [8];
  undefined1 local_68 [28];
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char16_t *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  this_00.m_data = operator_new(0x28);
  QMenu::QMenu((QMenu *)this_00.m_data,&this->super_QWidget);
  QVar12.m_size = (size_t)"qt_edit_menu";
  QVar12.field_0.m_data = this_00.m_data;
  QObject::setObjectName(QVar12);
  uVar7 = *(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50);
  if ((uVar7 & 4) == 0) {
    QMetaObject::tr((char *)&local_138,(char *)&staticMetaObject,0x6d8184);
    bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar4 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_70,Undo);
      cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar5 != '\0') goto LAB_0041b658;
      QKeySequence::QKeySequence(local_b0,Undo);
      QKeySequence::toString((SequenceFormat)&local_a8);
      local_90.b.d.size = local_98;
      local_90.b.d.ptr = pcStack_a0;
      local_90.b.d.d = (Data *)local_a8;
      local_90.a = L'\t';
      local_a8 = (QArrayData *)0x0;
      pcStack_a0 = (char16_t *)0x0;
      local_98 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_1b8,&local_90);
      bVar6 = true;
      bVar4 = 1;
      local_40 = local_1b8.b.d.ptr;
      local_68._24_4_ = local_1b8._0_4_;
      uStack_4c = local_1b8._4_4_;
      uStack_48 = local_1b8.b.d.d._0_4_;
      uStack_44 = local_1b8.b.d.d._4_4_;
    }
    else {
LAB_0041b658:
      bVar4 = bVar4 ^ 1;
      bVar6 = false;
      local_40 = (char16_t *)0x0;
      local_68._24_4_ = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0;
    }
    local_68._16_8_ = local_138.b.d.ptr;
    local_68._8_8_ = local_138.b.d.d;
    local_68._0_8_ = local_138._0_8_;
    local_138._0_8_ = (QArrayData *)0x0;
    local_138.b.d.d = (Data *)0x0;
    local_138.b.d.ptr = (char16_t *)0x0;
    local_1b8._0_8_ = (QArrayData *)0x0;
    local_1b8.b.d.d = (Data *)0x0;
    local_1b8.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>
              ((QString *)&local_e0,(QStringBuilder<QString,_QString> *)local_68);
    pQVar8 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_e0);
    if ((QArrayData *)local_e0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e0._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_68);
    if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
      }
    }
    if (bVar6) {
      if (&(local_90.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_a8 != (QArrayData *)0x0) {
        LOCK();
        (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_b0);
    }
    if (bVar4 != 0) {
      QKeySequence::~QKeySequence(local_70);
    }
    if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
      }
    }
    QWidgetLineControl::isUndoAvailable(*(QWidgetLineControl **)(lVar1 + 600));
    QAction::setEnabled(SUB81(pQVar8,0));
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-undo";
    local_68._16_8_ = 9;
    QObject::doSetObjectName((QString *)pQVar8);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-undo";
    local_68._16_8_ = 9;
    setActionIcon(pQVar8,(QString *)local_68);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_e0._0_8_ = undo;
    local_e0.b.d.d = (Data *)0x0;
    local_68._0_8_ = QAction::triggered;
    local_68._8_8_ = (char16_t *)0x0;
    puVar9 = (undefined4 *)operator_new(0x20);
    *puVar9 = 1;
    *(code **)(puVar9 + 2) =
         QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar9 + 4) = undo;
    *(undefined8 *)(puVar9 + 6) = 0;
    QObject::connectImpl
              (local_b8,(void **)pQVar8,(QObject *)local_68,(void **)this,
               (QSlotObjectBase *)&local_e0,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_b8);
    QMetaObject::tr((char *)&local_1b8,(char *)&staticMetaObject,0x6d818a);
    bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar4 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_c0,Redo);
      cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar5 != '\0') goto LAB_0041b9f3;
      QKeySequence::QKeySequence(local_100,Redo);
      QKeySequence::toString((SequenceFormat)&local_f8);
      local_e0.b.d.size = local_e8;
      local_e0.b.d.ptr = pcStack_f0;
      local_e0.b.d.d = (Data *)local_f8;
      local_e0.a = 9;
      local_f8 = (QArrayData *)0x0;
      pcStack_f0 = (char16_t *)0x0;
      local_e8 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_238,&local_e0);
      bVar6 = true;
      bVar4 = 1;
      local_40 = local_238.b.d.ptr;
      local_68._24_4_ = local_238._0_4_;
      uStack_4c = local_238._4_4_;
      uStack_48 = local_238.b.d.d._0_4_;
      uStack_44 = local_238.b.d.d._4_4_;
    }
    else {
LAB_0041b9f3:
      bVar4 = bVar4 ^ 1;
      bVar6 = false;
      local_40 = (char16_t *)0x0;
      local_68._24_4_ = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0;
    }
    local_68._16_8_ = local_1b8.b.d.ptr;
    local_68._8_8_ = local_1b8.b.d.d;
    local_68._0_8_ = local_1b8._0_8_;
    local_1b8._0_8_ = (QArrayData *)0x0;
    local_1b8.b.d.d = (Data *)0x0;
    local_1b8.b.d.ptr = (char16_t *)0x0;
    local_238._0_8_ = (QArrayData *)0x0;
    local_238.b.d.d = (Data *)0x0;
    local_238.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>
              ((QString *)&local_138,(QStringBuilder<QString,_QString> *)local_68);
    pQVar8 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_138);
    if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_68);
    if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
      }
    }
    if (bVar6) {
      if (&(local_e0.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e0.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_f8 != (QArrayData *)0x0) {
        LOCK();
        (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_f8,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_100);
    }
    if (bVar4 != 0) {
      QKeySequence::~QKeySequence(local_c0);
    }
    if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
      }
    }
    QWidgetLineControl::isRedoAvailable(*(QWidgetLineControl **)(lVar1 + 600));
    QAction::setEnabled(SUB81(pQVar8,0));
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-redo";
    local_68._16_8_ = 9;
    QObject::doSetObjectName((QString *)pQVar8);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-redo";
    local_68._16_8_ = 9;
    setActionIcon(pQVar8,(QString *)local_68);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_138._0_8_ = redo;
    local_138.b.d.d = (Data *)0x0;
    local_68._0_8_ = QAction::triggered;
    local_68._8_8_ = (char16_t *)0x0;
    puVar9 = (undefined4 *)operator_new(0x20);
    *puVar9 = 1;
    *(code **)(puVar9 + 2) =
         QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar9 + 4) = redo;
    *(undefined8 *)(puVar9 + 6) = 0;
    QObject::connectImpl
              (local_108,(void **)pQVar8,(QObject *)local_68,(void **)this,
               (QSlotObjectBase *)&local_138,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_108);
    QMenu::addSeparator((QMenu *)this_00.m_data);
    uVar7 = *(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50);
  }
  if ((uVar7 & 4) == 0) {
    QMetaObject::tr((char *)&local_238,(char *)&staticMetaObject,0x6d8190);
    bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar4 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_110,Cut);
      cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar5 != '\0') goto LAB_0041bdbb;
      QKeySequence::QKeySequence(local_160,Cut);
      QKeySequence::toString((SequenceFormat)&local_158);
      local_138.b.d.size = local_148;
      local_138.b.d.ptr = pcStack_150;
      local_138.b.d.d = (Data *)local_158;
      local_138.a = 9;
      local_158 = (QArrayData *)0x0;
      pcStack_150 = (char16_t *)0x0;
      local_148 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_2b8,&local_138);
      bVar4 = 1;
      bVar6 = true;
      local_40 = local_2b8.b.d.ptr;
      local_68._24_4_ = local_2b8._0_4_;
      uStack_4c = local_2b8._4_4_;
      uStack_48 = local_2b8.b.d.d._0_4_;
      uStack_44 = local_2b8.b.d.d._4_4_;
    }
    else {
LAB_0041bdbb:
      bVar4 = bVar4 ^ 1;
      bVar6 = false;
      local_40 = (char16_t *)0x0;
      local_68._24_4_ = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0;
    }
    local_68._16_8_ = local_238.b.d.ptr;
    local_68._8_8_ = local_238.b.d.d;
    local_68._0_8_ = local_238._0_8_;
    local_238._0_8_ = (QArrayData *)0x0;
    local_238.b.d.d = (Data *)0x0;
    local_238.b.d.ptr = (char16_t *)0x0;
    local_2b8._0_8_ = (QArrayData *)0x0;
    local_2b8.b.d.d = (Data *)0x0;
    local_2b8.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>
              ((QString *)&local_1b8,(QStringBuilder<QString,_QString> *)local_68);
    pQVar8 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_1b8);
    if ((QArrayData *)local_1b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_68);
    if ((QArrayData *)local_2b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
      }
    }
    if (bVar6) {
      if (&(local_138.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_138.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_158 != (QArrayData *)0x0) {
        LOCK();
        (local_158->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_158->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_158->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_158,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_160);
    }
    if (bVar4 != 0) {
      QKeySequence::~QKeySequence(local_110);
    }
    if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
      }
    }
    QAction::setEnabled(SUB81(pQVar8,0));
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-cut";
    local_68._16_8_ = 8;
    QObject::doSetObjectName((QString *)pQVar8);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-cut";
    local_68._16_8_ = 8;
    setActionIcon(pQVar8,(QString *)local_68);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_1b8._0_8_ = cut;
    local_1b8.b.d.d = (Data *)0x0;
    local_68._0_8_ = QAction::triggered;
    local_68._8_8_ = (char16_t *)0x0;
    puVar9 = (undefined4 *)operator_new(0x20);
    *puVar9 = 1;
    *(code **)(puVar9 + 2) =
         QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar9 + 4) = cut;
    *(undefined8 *)(puVar9 + 6) = 0;
    QObject::connectImpl
              (local_168,(void **)pQVar8,(QObject *)local_68,(void **)this,
               (QSlotObjectBase *)&local_1b8,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_168);
  }
  QMetaObject::tr((char *)&local_2b8,(char *)&staticMetaObject,0x6d8195);
  bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
  if (bVar4 == 0) {
    pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
    QKeySequence::QKeySequence(local_190,Copy);
    cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
    if (cVar5 != '\0') goto LAB_0041c171;
    QKeySequence::QKeySequence(local_1e0,Copy);
    QKeySequence::toString((SequenceFormat)&local_1d8);
    local_1b8.b.d.size = local_1c8;
    local_1b8.b.d.ptr = pcStack_1d0;
    local_1b8.b.d.d = (Data *)local_1d8;
    local_1b8.a = 9;
    local_1d8 = (QArrayData *)0x0;
    pcStack_1d0 = (char16_t *)0x0;
    local_1c8 = 0;
    QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_188,&local_1b8);
    bVar4 = 1;
    bVar6 = true;
    local_40 = (char16_t *)local_188.d.size;
    local_68._24_4_ = local_188.d.d._0_4_;
    uStack_4c = local_188.d.d._4_4_;
    uStack_48 = local_188.d.ptr._0_4_;
    uStack_44 = local_188.d.ptr._4_4_;
  }
  else {
LAB_0041c171:
    bVar4 = bVar4 ^ 1;
    bVar6 = false;
    local_40 = (char16_t *)0;
    local_68._24_4_ = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
  }
  local_68._16_8_ = local_2b8.b.d.ptr;
  local_68._8_8_ = local_2b8.b.d.d;
  local_68._0_8_ = local_2b8._0_8_;
  local_2b8._0_8_ = (QArrayData *)0x0;
  local_2b8.b.d.d = (Data *)0x0;
  local_2b8.b.d.ptr = (char16_t *)0x0;
  local_188.d.d = (Data *)0x0;
  local_188.d.ptr = (char16_t *)0x0;
  local_188.d.size = 0;
  QStringBuilder<QString,_QString>::convertTo<QString>
            ((QString *)&local_238,(QStringBuilder<QString,_QString> *)local_68);
  pQVar8 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_238);
  if ((QArrayData *)local_238._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_238._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_238._0_8_,2,0x10);
    }
  }
  QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_68);
  if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar6) {
    if (&(local_1b8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1b8.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_1d8 != (QArrayData *)0x0) {
      LOCK();
      (local_1d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1d8,2,0x10);
      }
    }
    QKeySequence::~QKeySequence(local_1e0);
  }
  if (bVar4 != 0) {
    QKeySequence::~QKeySequence(local_190);
  }
  if ((QArrayData *)local_2b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
    }
  }
  QAction::setEnabled(SUB81(pQVar8,0));
  local_68._0_8_ = (QArrayData *)0x0;
  local_68._8_8_ = L"edit-copy";
  local_68._16_8_ = 9;
  QObject::doSetObjectName((QString *)pQVar8);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  local_68._0_8_ = (QArrayData *)0x0;
  local_68._8_8_ = L"edit-copy";
  local_68._16_8_ = 9;
  setActionIcon(pQVar8,(QString *)local_68);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  local_238._0_8_ = copy;
  local_238.b.d.d = (Data *)0x0;
  local_68._0_8_ = QAction::triggered;
  local_68._8_8_ = (char16_t *)0x0;
  puVar9 = (undefined4 *)operator_new(0x20);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::QCallableObject<void_(QLineEdit::*)()_const,_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar9 + 4) = copy;
  *(undefined8 *)(puVar9 + 6) = 0;
  QObject::connectImpl
            (local_1e8,(void **)pQVar8,(QObject *)local_68,(void **)this,
             (QSlotObjectBase *)&local_238,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_1e8);
  uVar7 = *(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50);
  if ((uVar7 & 4) == 0) {
    QMetaObject::tr((char *)&local_188,(char *)&staticMetaObject,0x6d819b);
    bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar4 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_210,Paste);
      cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar5 != '\0') goto LAB_0041c532;
      QKeySequence::QKeySequence(local_260,Paste);
      QKeySequence::toString((SequenceFormat)&local_258);
      local_238.b.d.size = local_248;
      local_238.b.d.ptr = pcStack_250;
      local_238.b.d.d = (Data *)local_258;
      local_238.a = 9;
      local_258 = (QArrayData *)0x0;
      pcStack_250 = (char16_t *)0x0;
      local_248 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_208,&local_238);
      bVar4 = 1;
      bVar6 = true;
      local_40 = (char16_t *)local_208.d.size;
      local_68._24_4_ = (__int_type)local_208.d.d;
      uStack_4c = local_208.d.d._4_4_;
      uStack_48 = local_208.d.ptr._0_4_;
      uStack_44 = local_208.d.ptr._4_4_;
    }
    else {
LAB_0041c532:
      bVar4 = bVar4 ^ 1;
      bVar6 = false;
      local_40 = (char16_t *)0;
      local_68._24_4_ = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0;
    }
    local_68._16_8_ = local_188.d.size;
    local_68._8_8_ = local_188.d.ptr;
    local_68._0_8_ = local_188.d.d;
    local_188.d.d = (Data *)0x0;
    local_188.d.ptr = (char16_t *)0x0;
    local_188.d.size = 0;
    local_208.d.d = (Data *)0x0;
    local_208.d.ptr = (char16_t *)0x0;
    local_208.d.size = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>
              ((QString *)&local_2b8,(QStringBuilder<QString,_QString> *)local_68);
    pQVar8 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_2b8);
    if ((QArrayData *)local_2b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_2b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_68);
    if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar6) {
      if (&(local_238.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_238.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_238.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_238.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_238.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_258 != (QArrayData *)0x0) {
        LOCK();
        (local_258->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_258->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_258->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_258,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_260);
    }
    if (bVar4 != 0) {
      QKeySequence::~QKeySequence(local_210);
    }
    if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(byte *)(*(long *)(lVar1 + 600) + 0x50) & 4) == 0) {
      QGuiApplication::clipboard();
      QClipboard::text((Mode)local_68);
      QAction::setEnabled(SUB81(pQVar8,0));
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
    }
    else {
      QAction::setEnabled(SUB81(pQVar8,0));
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-paste";
    local_68._16_8_ = 10;
    QObject::doSetObjectName((QString *)pQVar8);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-paste";
    local_68._16_8_ = 10;
    setActionIcon(pQVar8,(QString *)local_68);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_2b8._0_8_ = paste;
    local_2b8.b.d.d = (Data *)0x0;
    local_68._0_8_ = QAction::triggered;
    local_68._8_8_ = (char16_t *)0x0;
    puVar9 = (undefined4 *)operator_new(0x20);
    *puVar9 = 1;
    *(code **)(puVar9 + 2) =
         QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar9 + 4) = paste;
    *(undefined8 *)(puVar9 + 6) = 0;
    QObject::connectImpl
              (local_268,(void **)pQVar8,(QObject *)local_68,(void **)this,
               (QSlotObjectBase *)&local_2b8,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_268);
    uVar7 = *(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50);
  }
  if ((uVar7 & 4) == 0) {
    QMetaObject::tr((char *)local_68,(char *)&staticMetaObject,0x6e59b4);
    pQVar8 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)local_68);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    if (((byte)(*(QWidgetLineControl **)(lVar1 + 600))[0x50] & 4) == 0) {
      QWidgetLineControl::text((QString *)local_68,*(QWidgetLineControl **)(lVar1 + 600));
      QAction::setEnabled(SUB81(pQVar8,0));
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
    }
    else {
      QAction::setEnabled(SUB81(pQVar8,0));
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-delete";
    local_68._16_8_ = 0xb;
    QObject::doSetObjectName((QString *)pQVar8);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_68._0_8_ = (QArrayData *)0x0;
    local_68._8_8_ = L"edit-delete";
    local_68._16_8_ = 0xb;
    setActionIcon(pQVar8,(QString *)local_68);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    ppvVar2 = *(void ***)(lVar1 + 600);
    local_2b8._0_8_ = QWidgetLineControl::_q_deleteSelected;
    local_2b8.b.d.d = (Data *)0x0;
    local_68._0_8_ = QAction::triggered;
    local_68._8_8_ = (char16_t *)0x0;
    puVar9 = (undefined4 *)operator_new(0x20);
    *puVar9 = 1;
    *(code **)(puVar9 + 2) =
         QtPrivate::QCallableObject<void_(QWidgetLineControl::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar9 + 4) = QWidgetLineControl::_q_deleteSelected;
    *(undefined8 *)(puVar9 + 6) = 0;
    QObject::connectImpl
              (local_270,(void **)pQVar8,(QObject *)local_68,ppvVar2,(QSlotObjectBase *)&local_2b8,
               (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_270);
  }
  bVar6 = QMenu::isEmpty((QMenu *)this_00.m_data);
  if (!bVar6) {
    QMenu::addSeparator((QMenu *)this_00.m_data);
  }
  QMetaObject::tr((char *)&local_208,(char *)&staticMetaObject,0x6dd596);
  bVar4 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
  if (bVar4 == 0) {
    pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
    QKeySequence::QKeySequence(local_290,SelectAll);
    cVar5 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
    if (cVar5 == '\0') {
      QKeySequence::QKeySequence(local_2e0,SelectAll);
      QKeySequence::toString((SequenceFormat)&local_2d8);
      local_2b8.b.d.size = local_2c8;
      local_2b8.b.d.ptr = pcStack_2d0;
      local_2b8.b.d.d = (Data *)local_2d8;
      local_2b8.a = 9;
      local_2d8 = (QArrayData *)0x0;
      pcStack_2d0 = (char16_t *)0x0;
      local_2c8 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_288,&local_2b8);
      bVar4 = 1;
      bVar6 = true;
      local_40 = (char16_t *)local_288.d.size;
      local_68._24_4_ = local_288.d.d._0_4_;
      uStack_4c = local_288.d.d._4_4_;
      uStack_48 = local_288.d.ptr._0_4_;
      uStack_44 = local_288.d.ptr._4_4_;
      goto LAB_0041cbf0;
    }
  }
  bVar4 = bVar4 ^ 1;
  bVar6 = false;
  local_40 = (char16_t *)0;
  local_68._24_4_ = 0;
  uStack_4c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
LAB_0041cbf0:
  local_68._16_8_ = local_208.d.size;
  local_68._8_8_ = local_208.d.ptr;
  local_68._0_8_ = local_208.d.d;
  local_208.d.d = (Data *)0x0;
  local_208.d.ptr = (char16_t *)0x0;
  local_208.d.size = 0;
  local_288.d.d = (Data *)0x0;
  local_288.d.ptr = (char16_t *)0x0;
  local_288.d.size = 0;
  QStringBuilder<QString,_QString>::convertTo<QString>
            (&local_188,(QStringBuilder<QString,_QString> *)local_68);
  pQVar8 = QWidget::addAction((QWidget *)this_00.m_data,&local_188);
  if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_68);
  if (&(local_288.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar6) {
    if (&(local_2b8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2b8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2b8.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_2d8 != (QArrayData *)0x0) {
      LOCK();
      (local_2d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_2d8,2,0x10);
      }
    }
    QKeySequence::~QKeySequence(local_2e0);
  }
  if (bVar4 != 0) {
    QKeySequence::~QKeySequence(local_290);
  }
  if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
    }
  }
  QWidgetLineControl::text((QString *)local_68,*(QWidgetLineControl **)(lVar1 + 600));
  QAction::setEnabled(SUB81(pQVar8,0));
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  local_68._0_8_ = (QArrayData *)0x0;
  local_68._8_8_ = L"select-all";
  local_68._16_8_ = 10;
  QObject::doSetObjectName((QString *)pQVar8);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  local_68._0_8_ = (QArrayData *)0x0;
  local_68._8_8_ = L"edit-select-all";
  local_68._16_8_ = 0xf;
  setActionIcon(pQVar8,(QString *)local_68);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  uVar10 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar8);
  piVar3 = *(int **)(lVar1 + 0x260);
  *(undefined8 *)(lVar1 + 0x260) = uVar10;
  *(QAction **)(lVar1 + 0x268) = pQVar8;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  local_188.d.d = (Data *)selectAll;
  local_188.d.ptr = (char16_t *)0x0;
  local_68._0_8_ = QAction::triggered;
  local_68._8_8_ = (char16_t *)0x0;
  puVar9 = (undefined4 *)operator_new(0x20);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::QCallableObject<void_(QLineEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar9 + 4) = selectAll;
  *(undefined8 *)(puVar9 + 6) = 0;
  QObject::connectImpl
            (local_2e8,(void **)pQVar8,(QObject *)local_68,(void **)this,
             (QSlotObjectBase *)&local_188,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_2e8);
  if ((*(byte *)(*(long *)(lVar1 + 600) + 0x50) & 4) == 0) {
    QGuiApplication::styleHints();
    cVar5 = QStyleHints::useRtlExtensions();
    if (cVar5 != '\0') {
      QMenu::addSeparator((QMenu *)this_00.m_data);
      this_01 = (QUnicodeControlCharacterMenu *)operator_new(0x30);
      QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu
                (this_01,(QObject *)this,(QWidget *)this_00.m_data);
      QMenu::addMenu((QMenu *)this_00.m_data,(QMenu *)this_01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMenu *)this_00.m_data;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QLineEdit::createStandardContextMenu()
{
    Q_D(QLineEdit);
    QMenu *popup = new QMenu(this);
    popup->setObjectName("qt_edit_menu"_L1);
    QAction *action = nullptr;

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("&Undo") + ACCEL_KEY(QKeySequence::Undo));
        action->setEnabled(d->control->isUndoAvailable());
        action->setObjectName(QStringLiteral("edit-undo"));
        setActionIcon(action, QStringLiteral("edit-undo"));
        connect(action, &QAction::triggered, this, &QLineEdit::undo);

        action = popup->addAction(QLineEdit::tr("&Redo") + ACCEL_KEY(QKeySequence::Redo));
        action->setEnabled(d->control->isRedoAvailable());
        action->setObjectName(QStringLiteral("edit-redo"));
        setActionIcon(action, QStringLiteral("edit-redo"));
        connect(action, &QAction::triggered, this, &QLineEdit::redo);

        popup->addSeparator();
    }

#ifndef QT_NO_CLIPBOARD
    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("Cu&t") + ACCEL_KEY(QKeySequence::Cut));
        action->setEnabled(!d->control->isReadOnly() && d->control->hasSelectedText()
                && d->control->echoMode() == QLineEdit::Normal);
        action->setObjectName(QStringLiteral("edit-cut"));
        setActionIcon(action, QStringLiteral("edit-cut"));
        connect(action, &QAction::triggered, this, &QLineEdit::cut);
    }

    action = popup->addAction(QLineEdit::tr("&Copy") + ACCEL_KEY(QKeySequence::Copy));
    action->setEnabled(d->control->hasSelectedText()
            && d->control->echoMode() == QLineEdit::Normal);
    action->setObjectName(QStringLiteral("edit-copy"));
    setActionIcon(action, QStringLiteral("edit-copy"));
    connect(action, &QAction::triggered, this, &QLineEdit::copy);

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("&Paste") + ACCEL_KEY(QKeySequence::Paste));
        action->setEnabled(!d->control->isReadOnly() && !QGuiApplication::clipboard()->text().isEmpty());
        action->setObjectName(QStringLiteral("edit-paste"));
        setActionIcon(action, QStringLiteral("edit-paste"));
        connect(action, &QAction::triggered, this, &QLineEdit::paste);
    }
#endif

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("Delete"));
        action->setEnabled(!d->control->isReadOnly() && !d->control->text().isEmpty() && d->control->hasSelectedText());
        action->setObjectName(QStringLiteral("edit-delete"));
        setActionIcon(action, QStringLiteral("edit-delete"));
        connect(action, &QAction::triggered,
                d->control, &QWidgetLineControl::_q_deleteSelected);
    }

    if (!popup->isEmpty())
        popup->addSeparator();

    action = popup->addAction(QLineEdit::tr("Select All") + ACCEL_KEY(QKeySequence::SelectAll));
    action->setEnabled(!d->control->text().isEmpty() && !d->control->allSelected());
    action->setObjectName(QStringLiteral("select-all"));
    setActionIcon(action, QStringLiteral("edit-select-all"));
    d->selectAllAction = action;
    connect(action, &QAction::triggered, this, &QLineEdit::selectAll);

    if (!d->control->isReadOnly() && QGuiApplication::styleHints()->useRtlExtensions()) {
        popup->addSeparator();
        QUnicodeControlCharacterMenu *ctrlCharacterMenu = new QUnicodeControlCharacterMenu(this, popup);
        popup->addMenu(ctrlCharacterMenu);
    }
    return popup;
}